

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

QSize __thiscall QLabelPrivate::sizeForWidth(QLabelPrivate *this,int w)

{
  QRect QVar1;
  bool bVar2;
  int iVar3;
  int iVar7;
  QLabel *pQVar8;
  int *piVar9;
  ulong uVar10;
  LayoutDirection LVar4;
  Int IVar5;
  Int IVar6;
  QStyle *pQVar11;
  QSize QVar12;
  uint uVar13;
  int in_ESI;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar14;
  QRect QVar15;
  bool tryWidth;
  int flags;
  qreal oldTextWidth;
  int m;
  int align;
  int vextra;
  int hextra;
  QLabel *q;
  QSize contentsSize;
  QSizeF controlSize;
  QFontMetrics fm;
  QRect br;
  QSize contentsMargin;
  QStyleOption opt;
  QWidget *in_stack_fffffffffffffd78;
  LayoutDirection in_stack_fffffffffffffd80;
  QFlag in_stack_fffffffffffffd84;
  QLabelPrivate *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  QStyleOption *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  QFontMetrics *in_stack_fffffffffffffda8;
  bool local_22d;
  undefined2 in_stack_fffffffffffffde4;
  byte bVar16;
  byte bVar17;
  undefined4 in_stack_fffffffffffffdf0;
  uint uVar18;
  int local_1fc;
  int local_1ec;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  int local_160;
  int local_15c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_158;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_154;
  undefined8 local_140;
  undefined8 local_138;
  QSizeF local_130;
  int local_120;
  int local_11c;
  QChar local_116;
  QFlag local_114 [2];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_10c;
  QPixmap local_108 [24];
  undefined8 local_f0;
  QSize local_e0;
  QPixmap local_d8 [24];
  QRect local_c0;
  QPixmap local_b0 [24];
  QRect local_98;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  int local_50;
  int local_4c;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = in_ESI;
  pQVar8 = q_func(in_RDI);
  iVar3 = QWidget::minimumWidth
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80));
  if (0 < iVar3) {
    local_50 = QWidget::minimumWidth
                         ((QWidget *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80)
                         );
    piVar9 = qMax<int>(&local_4c,&local_50);
    local_4c = *piVar9;
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80));
  local_1ec = in_RDI->margin * 2;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics(in_stack_fffffffffffffd78);
  bVar2 = std::optional::operator_cast_to_bool((optional<QIcon> *)0x5aed0c);
  if (bVar2) {
    std::optional<QIcon>::operator->((optional<QIcon> *)0x5aed23);
    uVar10 = QIcon::isNull();
    if ((uVar10 & 1) == 0) {
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                     (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78)
      ;
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (QPoint *)in_stack_fffffffffffffd98,
                   (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      QVar14.x2.m_i = local_98.x2.m_i;
      QVar14.y2.m_i = local_98.y2.m_i;
      QVar14.x1.m_i = local_98.x1.m_i;
      QVar14.y1.m_i = local_98.y1.m_i;
      QVar1.x2.m_i = local_c0.x2.m_i;
      QVar1.y2.m_i = local_c0.y2.m_i;
      QVar1.x1.m_i = local_c0.x1.m_i;
      QVar1.y1.m_i = local_c0.y1.m_i;
      QVar15.x2.m_i = (undefined4)local_78;
      QVar15.y2.m_i = local_78._4_4_;
      QVar15.x1.m_i = (undefined4)local_80;
      QVar15.y1.m_i = local_80._4_4_;
      goto LAB_005af774;
    }
  }
  bVar2 = std::optional::operator_cast_to_bool((optional<QPicture> *)0x5aed97);
  if (bVar2) {
    std::optional<QPicture>::operator->((optional<QPicture> *)0x5aedae);
    uVar10 = QPicture::isNull();
    if ((uVar10 & 1) == 0) {
      std::optional<QPicture>::operator->((optional<QPicture> *)0x5aedcb);
      QVar14 = (QRect)QPicture::boundingRect();
      QVar1.x2.m_i = local_c0.x2.m_i;
      QVar1.y2.m_i = local_c0.y2.m_i;
      QVar1.x1.m_i = local_c0.x1.m_i;
      QVar1.y1.m_i = local_c0.y1.m_i;
      QVar15 = QVar14;
      goto LAB_005af774;
    }
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMovie> *)0x5aee19);
  bVar16 = 0;
  bVar17 = bVar16;
  if (bVar2) {
    QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5aee41);
    QMovie::currentPixmap();
    bVar16 = QPixmap::isNull();
    bVar16 = bVar16 ^ 0xff;
    bVar17 = bVar16;
    QPixmap::~QPixmap(local_b0);
  }
  if ((bVar16 & 1) == 0) {
    if ((*(ushort *)&in_RDI->field_0x340 >> 4 & 1) == 0) {
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                     (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78)
      ;
      QFontMetrics::averageCharWidth();
      QFontMetrics::lineSpacing();
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                   (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78);
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (QPoint *)in_stack_fffffffffffffd98,
                   (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      QVar14.x2.m_i = local_98.x2.m_i;
      QVar14.y2.m_i = local_98.y2.m_i;
      QVar14.x1.m_i = local_98.x1.m_i;
      QVar14.y1.m_i = local_98.y1.m_i;
      QVar1.x2.m_i = local_c0.x2.m_i;
      QVar1.y2.m_i = local_c0.y2.m_i;
      QVar1.x1.m_i = local_c0.x1.m_i;
      QVar1.y1.m_i = local_c0.y1.m_i;
      QVar15._8_8_ = local_1a0;
      QVar15._0_8_ = local_1a8;
    }
    else {
      LVar4 = textDirection(in_stack_fffffffffffffd88);
      QFlag::QFlag(local_114,in_RDI->align);
      QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
                ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd84);
      local_10c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QStyle::visualAlignment
                     (in_stack_fffffffffffffd80,
                      (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                      SUB84((ulong)in_stack_fffffffffffffd88 >> 0x20,0));
      IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10c);
      local_1fc = in_RDI->indent;
      if ((local_1fc < 0) &&
         (iVar3 = QFrame::frameWidth((QFrame *)
                                     CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80)
                                    ), iVar3 != 0)) {
        QChar::QChar<char16_t,_true>(&local_116,L'x');
        local_1fc = QFontMetrics::horizontalAdvance((QChar *)&local_70);
        local_1fc = local_1fc + in_RDI->margin * -2;
      }
      if ((0 < local_1fc) && (((IVar5 & 1) != 0 || ((IVar5 & 2) != 0)))) {
        local_1ec = local_1fc + local_1ec;
      }
      if (in_RDI->control == (QWidgetTextControl *)0x0) {
        local_158.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             Qt::operator|(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80);
        local_154.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator~
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80));
        IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_154);
        uVar13 = IVar5 & IVar6;
        if ((*(ushort *)&in_RDI->field_0x340 >> 5 & 1) != 0) {
          uVar13 = uVar13 | 0x800;
          memset(local_48,0xaa,0x40);
          QStyleOption::QStyleOption
                    (in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,in_stack_fffffffffffffd90);
          QStyleOption::initFrom
                    (in_stack_fffffffffffffd98,
                     (QWidget *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
          pQVar11 = QWidget::style(in_stack_fffffffffffffd78);
          iVar3 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x29,local_48,pQVar8,0);
          if (iVar3 == 0) {
            uVar13 = uVar13 | 0x8000;
          }
          QStyleOption::~QStyleOption
                    ((QStyleOption *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80)
                    );
        }
        bVar2 = (IVar5 & 0x1000) != 0;
        local_22d = local_4c < 0 && bVar2;
        uVar18 = CONCAT13(local_22d,(int3)in_stack_fffffffffffffdf0);
        if (local_4c < 0 && bVar2) {
          local_15c = QFontMetrics::averageCharWidth();
          local_15c = local_15c * 0x50;
          QWidget::maximumSize
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
          local_160 = QSize::width((QSize *)0x5af443);
          piVar9 = qMin<int>(&local_15c,&local_160);
          local_4c = *piVar9;
        }
        else if (local_4c < 0) {
          local_4c = 2000;
        }
        iVar3 = QSize::width((QSize *)0x5af499);
        local_4c = local_4c - (local_1ec + iVar3);
        in_stack_fffffffffffffd78 = (QWidget *)&in_RDI->text;
        in_stack_fffffffffffffd80 = LeftToRight;
        in_stack_fffffffffffffd88 = (QLabelPrivate *)0x0;
        QVar15 = QFontMetrics::boundingRect
                           (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                            in_stack_fffffffffffffda0,
                            (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                            (int)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                            (QString *)
                            CONCAT17(bVar17,CONCAT16(bVar16,CONCAT24(in_stack_fffffffffffffde4,LVar4
                                                                    ))),(int)in_RDI,
                            (int *)CONCAT44(uVar13,uVar18));
        local_178 = QVar15._0_8_;
        local_68._0_8_ = local_178;
        local_170 = QVar15._8_8_;
        local_68._8_8_ = local_170;
        if ((uVar18 & 0x1000000) != 0) {
          iVar3 = QRect::height((QRect *)in_stack_fffffffffffffd78);
          iVar7 = QFontMetrics::lineSpacing();
          if ((SBORROW4(iVar3,iVar7 * 4) != iVar3 + iVar7 * -4 < 0) &&
             (iVar3 = QRect::width((QRect *)in_stack_fffffffffffffd78), local_4c / 2 < iVar3)) {
            in_stack_fffffffffffffd78 = (QWidget *)&in_RDI->text;
            in_stack_fffffffffffffd80 = LeftToRight;
            in_stack_fffffffffffffd88 = (QLabelPrivate *)0x0;
            QVar15 = QFontMetrics::boundingRect
                               (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                                in_stack_fffffffffffffda0,
                                (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                                (int)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                                (QString *)
                                CONCAT17(bVar17,CONCAT16(bVar16,CONCAT24(in_stack_fffffffffffffde4,
                                                                         LVar4))),(int)in_RDI,
                                (int *)CONCAT44(uVar13,uVar18));
            local_188 = QVar15._0_8_;
            local_68._0_8_ = local_188;
            local_180 = QVar15._8_8_;
            local_68._8_8_ = local_180;
          }
        }
        QVar14.x2.m_i = local_98.x2.m_i;
        QVar14.y2.m_i = local_98.y2.m_i;
        QVar14.x1.m_i = local_98.x1.m_i;
        QVar14.y1.m_i = local_98.y1.m_i;
        QVar1.x2.m_i = local_c0.x2.m_i;
        QVar1.y2.m_i = local_c0.y2.m_i;
        QVar1.x1.m_i = local_c0.x1.m_i;
        QVar1.y1.m_i = local_c0.y1.m_i;
        QVar15.x2.m_i = local_68._8_4_;
        QVar15.y2.m_i = local_68._12_4_;
        QVar15.x1.m_i = local_68._0_4_;
        QVar15.y1.m_i = local_68._4_4_;
        if ((uVar18 & 0x1000000) != 0) {
          iVar3 = QRect::height((QRect *)in_stack_fffffffffffffd78);
          iVar7 = QFontMetrics::lineSpacing();
          QVar14.x2.m_i = local_98.x2.m_i;
          QVar14.y2.m_i = local_98.y2.m_i;
          QVar14.x1.m_i = local_98.x1.m_i;
          QVar14.y1.m_i = local_98.y1.m_i;
          QVar1.x2.m_i = local_c0.x2.m_i;
          QVar1.y2.m_i = local_c0.y2.m_i;
          QVar1.x1.m_i = local_c0.x1.m_i;
          QVar1.y1.m_i = local_c0.y1.m_i;
          QVar15.x2.m_i = local_68._8_4_;
          QVar15.y2.m_i = local_68._12_4_;
          QVar15.x1.m_i = local_68._0_4_;
          QVar15.y1.m_i = local_68._4_4_;
          if (SBORROW4(iVar3,iVar7 * 2) != iVar3 + iVar7 * -2 < 0) {
            iVar3 = QRect::width((QRect *)in_stack_fffffffffffffd78);
            QVar14.x2.m_i = local_98.x2.m_i;
            QVar14.y2.m_i = local_98.y2.m_i;
            QVar14.x1.m_i = local_98.x1.m_i;
            QVar14.y1.m_i = local_98.y1.m_i;
            QVar1.x2.m_i = local_c0.x2.m_i;
            QVar1.y2.m_i = local_c0.y2.m_i;
            QVar1.x1.m_i = local_c0.x1.m_i;
            QVar1.y1.m_i = local_c0.y1.m_i;
            QVar15.x2.m_i = local_68._8_4_;
            QVar15.y2.m_i = local_68._12_4_;
            QVar15.x1.m_i = local_68._0_4_;
            QVar15.y1.m_i = local_68._4_4_;
            if (local_4c / 4 < iVar3) {
              in_stack_fffffffffffffd78 = (QWidget *)&in_RDI->text;
              in_stack_fffffffffffffd80 = LeftToRight;
              in_stack_fffffffffffffd88 = (QLabelPrivate *)0x0;
              QVar15 = QFontMetrics::boundingRect
                                 (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                                  in_stack_fffffffffffffda0,
                                  (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                                  (int)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                                  (QString *)
                                  CONCAT17(bVar17,CONCAT16(bVar16,CONCAT24(in_stack_fffffffffffffde4
                                                                           ,LVar4))),(int)in_RDI,
                                  (int *)CONCAT44(uVar13,uVar18));
              QVar14.x2.m_i = local_98.x2.m_i;
              QVar14.y2.m_i = local_98.y2.m_i;
              QVar14.x1.m_i = local_98.x1.m_i;
              QVar14.y1.m_i = local_98.y1.m_i;
              QVar1.x2.m_i = local_c0.x2.m_i;
              QVar1.y2.m_i = local_c0.y2.m_i;
              QVar1.x1.m_i = local_c0.x1.m_i;
              QVar1.y1.m_i = local_c0.y1.m_i;
            }
          }
        }
      }
      else {
        ensureTextLayouted(in_stack_fffffffffffffd88);
        QWidgetTextControl::textWidth
                  ((QWidgetTextControl *)
                   CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80));
        if ((IVar5 & 0x1000) == 0) {
          QWidgetTextControl::setTextWidth
                    ((QWidgetTextControl *)
                     CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                     (qreal)in_stack_fffffffffffffd78);
        }
        else if (local_4c < 0) {
          QWidgetTextControl::adjustSize
                    ((QWidgetTextControl *)
                     CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80));
        }
        else {
          local_1ec = local_4c - local_1ec;
          local_11c = QSize::width((QSize *)0x5af15c);
          local_11c = local_1ec - local_11c;
          local_120 = 0;
          piVar9 = qMax<int>(&local_11c,&local_120);
          local_4c = *piVar9;
          QWidgetTextControl::setTextWidth
                    ((QWidgetTextControl *)
                     CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                     (qreal)in_stack_fffffffffffffd78);
        }
        local_130.ht = -NAN;
        local_130.wd = -NAN;
        local_130 = QWidgetTextControl::size
                              ((QWidgetTextControl *)
                               CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80));
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                       (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                       (int)in_stack_fffffffffffffd78);
        QSizeF::width(&local_130);
        qCeil<double>(2.9447592122161e-317);
        QSizeF::height(&local_130);
        qCeil<double>(2.94477008166031e-317);
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                     (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78)
        ;
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (QPoint *)in_stack_fffffffffffffd98,
                     (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        local_68._0_8_ = local_140;
        local_68._8_8_ = local_138;
        QWidgetTextControl::setTextWidth
                  ((QWidgetTextControl *)
                   CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
                   (qreal)in_stack_fffffffffffffd78);
        QVar14.x2.m_i = local_98.x2.m_i;
        QVar14.y2.m_i = local_98.y2.m_i;
        QVar14.x1.m_i = local_98.x1.m_i;
        QVar14.y1.m_i = local_98.y1.m_i;
        QVar1.x2.m_i = local_c0.x2.m_i;
        QVar1.y2.m_i = local_c0.y2.m_i;
        QVar1.x1.m_i = local_c0.x1.m_i;
        QVar1.y1.m_i = local_c0.y1.m_i;
        QVar15.x2.m_i = local_68._8_4_;
        QVar15.y2.m_i = local_68._12_4_;
        QVar15.x1.m_i = local_68._0_4_;
        QVar15.y1.m_i = local_68._4_4_;
      }
    }
  }
  else {
    QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5aeeab);
    QMovie::currentPixmap();
    local_c0 = (QRect)QPixmap::rect();
    local_68 = (undefined1  [16])local_c0;
    QPixmap::~QPixmap(local_d8);
    QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5aef16);
    QMovie::currentPixmap();
    local_f0 = QPixmap::deviceIndependentSize();
    local_e0 = QSizeF::toSize((QSizeF *)
                              CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    QRect::setSize((QRect *)in_stack_fffffffffffffd98,
                   (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    QPixmap::~QPixmap(local_108);
    QVar14.x2.m_i = local_98.x2.m_i;
    QVar14.y2.m_i = local_98.y2.m_i;
    QVar14.x1.m_i = local_98.x1.m_i;
    QVar14.y1.m_i = local_98.y1.m_i;
    QVar15 = (QRect)local_68;
    QVar1 = local_c0;
  }
LAB_005af774:
  local_c0 = QVar1;
  local_68 = (undefined1  [16])QVar15;
  local_98 = QVar14;
  QRect::width((QRect *)in_stack_fffffffffffffd78);
  QRect::height((QRect *)in_stack_fffffffffffffd78);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80),
               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78);
  ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
              (QSize *)in_stack_fffffffffffffd88);
  QWidget::minimumSize((QWidget *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QVar12 = QSize::expandedTo((QSize *)in_stack_fffffffffffffd88,
                             (QSize *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80
                                              ));
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return QVar12;
}

Assistant:

QSize QLabelPrivate::sizeForWidth(int w) const
{
    Q_Q(const QLabel);
    if (q->minimumWidth() > 0)
        w = qMax(w, q->minimumWidth());
    QSize contentsMargin(leftmargin + rightmargin, topmargin + bottommargin);

    QRect br;

    int hextra = 2 * margin;
    int vextra = hextra;
    QFontMetrics fm = q->fontMetrics();

    if (icon && !icon->isNull()) {
        br = QRect(QPoint(0, 0), pixmapSize);
#ifndef QT_NO_PICTURE
    } else if (picture && !picture->isNull()) {
        br = picture->boundingRect();
#endif
#if QT_CONFIG(movie)
    } else if (movie && !movie->currentPixmap().isNull()) {
        br = movie->currentPixmap().rect();
        br.setSize(movie->currentPixmap().deviceIndependentSize().toSize());
#endif
    } else if (isTextLabel) {
        int align = QStyle::visualAlignment(textDirection(), QFlag(this->align));
        // Add indentation
        int m = indent;

        if (m < 0 && q->frameWidth()) // no indent, but we do have a frame
            m = fm.horizontalAdvance(u'x') - margin*2;
        if (m > 0) {
            if ((align & Qt::AlignLeft) || (align & Qt::AlignRight))
                hextra += m;
            if ((align & Qt::AlignTop) || (align & Qt::AlignBottom))
                vextra += m;
        }

        if (control) {
            ensureTextLayouted();
            const qreal oldTextWidth = control->textWidth();
            // Calculate the length of document if w is the width
            if (align & Qt::TextWordWrap) {
                if (w >= 0) {
                    w = qMax(w-hextra-contentsMargin.width(), 0); // strip margin and indent
                    control->setTextWidth(w);
                } else {
                    control->adjustSize();
                }
            } else {
                control->setTextWidth(-1);
            }

            QSizeF controlSize = control->size();
            br = QRect(QPoint(0, 0), QSize(qCeil(controlSize.width()), qCeil(controlSize.height())));

            // restore state
            control->setTextWidth(oldTextWidth);
        } else {
            // Turn off center alignment in order to avoid rounding errors for centering,
            // since centering involves a division by 2. At the end, all we want is the size.
            int flags = align & ~(Qt::AlignVCenter | Qt::AlignHCenter);
            if (hasShortcut) {
                flags |= Qt::TextShowMnemonic;
                QStyleOption opt;
                opt.initFrom(q);
                if (!q->style()->styleHint(QStyle::SH_UnderlineShortcut, &opt, q))
                    flags |= Qt::TextHideMnemonic;
            }

            bool tryWidth = (w < 0) && (align & Qt::TextWordWrap);
            if (tryWidth)
                w = qMin(fm.averageCharWidth() * 80, q->maximumSize().width());
            else if (w < 0)
                w = 2000;
            w -= (hextra + contentsMargin.width());
            br = fm.boundingRect(0, 0, w ,2000, flags, text);
            if (tryWidth && br.height() < 4*fm.lineSpacing() && br.width() > w/2)
                br = fm.boundingRect(0, 0, w/2, 2000, flags, text);
            if (tryWidth && br.height() < 2*fm.lineSpacing() && br.width() > w/4)
                br = fm.boundingRect(0, 0, w/4, 2000, flags, text);
        }
    } else {
        br = QRect(QPoint(0, 0), QSize(fm.averageCharWidth(), fm.lineSpacing()));
    }

    const QSize contentsSize(br.width() + hextra, br.height() + vextra);
    return (contentsSize + contentsMargin).expandedTo(q->minimumSize());
}